

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O2

void __thiscall Cache::setByte(Cache *this,uint32_t addr,uint8_t val,uint32_t *cycles)

{
  uint32_t *puVar1;
  uint64_t *puVar2;
  pointer pBVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  Cache *this_00;
  
  while( true ) {
    this_00 = this;
    this_00->referenceCounter = this_00->referenceCounter + 1;
    puVar1 = &(this_00->statistics).numWrite;
    *puVar1 = *puVar1 + 1;
    uVar4 = getBlockId(this_00,addr);
    if (uVar4 != 0xffffffff) {
      uVar5 = getOffset(this_00,addr);
      puVar1 = &(this_00->statistics).numHit;
      *puVar1 = *puVar1 + 1;
      puVar2 = &(this_00->statistics).totalCycles;
      *puVar2 = *puVar2 + (ulong)(this_00->policy).hitLatency;
      pBVar3 = (this_00->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pBVar3[(int)uVar4].modified = true;
      pBVar3[(int)uVar4].lastReference = this_00->referenceCounter;
      *(uint8_t *)
       (*(long *)&pBVar3[(int)uVar4].data.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data + (ulong)uVar5) = val;
      if (this_00->writeBack == false) {
        writeBlockToLowerLevel
                  (this_00,(this_00->blocks).
                           super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
                           super__Vector_impl_data._M_start + (int)uVar4);
        puVar2 = &(this_00->statistics).totalCycles;
        *puVar2 = *puVar2 + (ulong)(this_00->policy).missLatency;
      }
      if (cycles != (uint32_t *)0x0) {
        *cycles = (this_00->policy).hitLatency;
      }
      return;
    }
    puVar1 = &(this_00->statistics).numMiss;
    *puVar1 = *puVar1 + 1;
    puVar2 = &(this_00->statistics).totalCycles;
    *puVar2 = *puVar2 + (ulong)(this_00->policy).missLatency;
    if (this_00->writeAllocate == true) break;
    cycles = (uint32_t *)0x0;
    this = this_00->lowerCache;
    if (this_00->lowerCache == (Cache *)0x0) {
      MemoryManager::setByteNoCache(this_00->memory,addr,val);
      return;
    }
  }
  loadBlockFromLowerLevel(this_00,addr,cycles);
  uVar4 = getBlockId(this_00,addr);
  if (uVar4 != 0xffffffff) {
    uVar5 = getOffset(this_00,addr);
    pBVar3 = (this_00->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pBVar3[(int)uVar4].modified = true;
    pBVar3[(int)uVar4].lastReference = this_00->referenceCounter;
    *(uint8_t *)
     (*(long *)&pBVar3[(int)uVar4].data.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data + (ulong)uVar5) = val;
    return;
  }
  fwrite("Error: data not in top level cache!\n",0x24,1,_stderr);
  exit(-1);
}

Assistant:

void Cache::setByte(uint32_t addr, uint8_t val, uint32_t *cycles) {
  this->referenceCounter++;
  this->statistics.numWrite++;

  // If in cache, write to it directly
  int blockId;
  if ((blockId = this->getBlockId(addr)) != -1) {
    uint32_t offset = this->getOffset(addr);
    this->statistics.numHit++;
    this->statistics.totalCycles += this->policy.hitLatency;
    this->blocks[blockId].modified = true;
    this->blocks[blockId].lastReference = this->referenceCounter;
    this->blocks[blockId].data[offset] = val;
    if (!this->writeBack) {
      this->writeBlockToLowerLevel(this->blocks[blockId]);
      this->statistics.totalCycles += this->policy.missLatency;
    }
    if (cycles) *cycles = this->policy.hitLatency;
    return;
  }

  // Else, load the data from cache
  // TODO: implement bypassing
  this->statistics.numMiss++;
  this->statistics.totalCycles += this->policy.missLatency;

  if (this->writeAllocate) {
    this->loadBlockFromLowerLevel(addr, cycles);

    if ((blockId = this->getBlockId(addr)) != -1) {
      uint32_t offset = this->getOffset(addr);
      this->blocks[blockId].modified = true;
      this->blocks[blockId].lastReference = this->referenceCounter;
      this->blocks[blockId].data[offset] = val;
      return;
    } else {
      fprintf(stderr, "Error: data not in top level cache!\n");
      exit(-1);
    }
  } else {
    if (this->lowerCache == nullptr) {
      this->memory->setByteNoCache(addr, val);
    } else {
      this->lowerCache->setByte(addr, val);
    }
  }
}